

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::BeginRead3dmBigChunk(ON_BinaryArchive *this,uint *typecode,ON__INT64 *value)

{
  uint uVar1;
  ulong offset;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ON__UINT64 offset_00;
  ON__UINT32 typecode_00;
  ON__UINT64 EOF_chunk_length;
  ON__INT64 v;
  ON__UINT32 tc;
  ulong local_48;
  undefined8 local_40;
  ulong local_38;
  
  bVar2 = ReadMode(this);
  if (!bVar2) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1893,"","ReadMode() = false.");
    if (typecode != (uint *)0x0) {
      *typecode = 0;
    }
    if (value != (ON__INT64 *)0x0) {
      *value = 0;
    }
    return false;
  }
  local_48 = 0;
  this->m_bDoChunkCRC = false;
  uVar1 = this->m_error_message_mask;
  this->m_error_message_mask = uVar1 | 1;
  local_40 = (ulong)local_40._4_4_ << 0x20;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_40);
  typecode_00 = 0;
  if (bVar2) {
    typecode_00 = (ON__UINT32)local_40;
  }
  this->m_error_message_mask = uVar1;
  if (!bVar2) goto LAB_00395b8a;
  if (typecode_00 == 0x7fff) {
    local_40 = 0;
    bVar2 = ReadChunkValue(this,0x7fff,(ON__INT64 *)&local_48);
    offset = local_48;
    if (((long)local_48 < 0 || !bVar2) || (local_48 < (ulong)(0x31 < this->m_3dm_version) * 4 + 4))
    {
      typecode_00 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x18d5,"","ON_BinaryArchive::BeginRead3dmChunk() - file is damaged.");
      bVar2 = false;
      goto LAB_00395b8a;
    }
    local_38 = this->m_current_positionX;
    bVar2 = ReadEOFSizeOfFile(this,&local_40);
    offset_00 = this->m_current_positionX - local_38;
    if ((local_38 <= this->m_current_positionX && offset_00 != 0) && local_38 != 0) {
      bVar3 = Internal_SeekCur(this,false,offset_00);
      bVar2 = bVar2 && bVar3;
    }
    if ((bVar2 != false) && (bVar3 = Internal_SeekCur(this,true,offset), bVar3)) {
      if (this->m_3dm_version < 2) {
        iVar4 = (*this->_vptr_ON_BinaryArchive[5])(this);
        if ((char)iVar4 == '\0') {
          typecode_00 = 0x7ffe;
        }
      }
      else if (this->m_current_positionX != local_40) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x18ca,"",
                   "ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
      }
      bVar2 = Internal_SeekCur(this,false,offset);
    }
    if (bVar2 == false) {
      bVar2 = false;
      goto LAB_00395b8a;
    }
  }
  else {
    bVar2 = ReadChunkValue(this,typecode_00,(ON__INT64 *)&local_48);
    if (!bVar2) goto LAB_00395b8a;
  }
  PushBigChunk(this,typecode_00,local_48);
  bVar2 = true;
LAB_00395b8a:
  if (typecode != (uint *)0x0) {
    *typecode = typecode_00;
  }
  if (value != (ON__INT64 *)0x0) {
    *value = local_48;
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::BeginRead3dmBigChunk( unsigned int* typecode, ON__INT64* value )
{
  if (false == ReadMode())
  {
    ON_ERROR("ReadMode() = false.");
    if (typecode)
      *typecode = 0;
    if (value)
      *value = 0;
    return false;
  }

  ON__UINT32 t = 0;
  ON__INT64 v = 0;
  m_bDoChunkCRC = false; // no CRC on chunk headers because length is written twice
  const unsigned int saved_error_message_mask = m_error_message_mask;
  m_error_message_mask |= 0x0001; // disable ReadByte() error message at EOF
  bool rc = ReadChunkTypecode( &t );
  m_error_message_mask = saved_error_message_mask;
  if (rc) 
  {
    if ( t == TCODE_ENDOFFILE ) 
    {
      // Either this chunk is a bona fide end of file mark, or it's "goo" 
      // that Rhino 1.0 or the pre-February 2000 Rhino 1.1 saved and wrote.
      ON__UINT64 sizeof_file = 0;
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc && v >= 0 && ((ON__UINT64)v) >= SizeofChunkLength() ) 
      {
        ON__UINT64 EOF_chunk_length = (ON__UINT64)v;
        ON__UINT64 pos0 = CurrentPosition();
        rc = ReadEOFSizeOfFile( &sizeof_file );
        ON__UINT64 pos1 = CurrentPosition();
        if ( pos0 > 0 && pos1 > pos0 )
        {
          if ( !SeekBackward(pos1-pos0) )
            rc = false;
        }
        if ( rc ) 
        {
          if ( SeekForward( EOF_chunk_length ) )
          {
            ON__UINT64 pos2 = CurrentPosition(); 
            if ( m_3dm_version <= 1 )
            {
              if ( !AtEnd() ) 
              {
                // Rhino v1 reads chunks with unknown typecodes as a block of "goo"
                // and then saves them back into file.  When this happens to an
                // eof marker, we get TCODE_ENDOFFILE chunks in the middle of a file.
                // This can only happen in m_3dm_version = 1 files.
                t = TCODE_ENDOFFILE_GOO;
              }
            }
            else
            {
              // check that current position matches saved file size
              if ( pos2 != sizeof_file ) {
                ON_ERROR("ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
              }
            }
            rc = SeekBackward( EOF_chunk_length );
          }
        }
        if ( rc )
          rc = PushBigChunk( t, v );
      }
      else 
      {
        ON_ERROR( "ON_BinaryArchive::BeginRead3dmChunk() - file is damaged." );
        rc = false;
        t = 0; // ?? file is trashed ??
      }
    }
    else 
    {
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc )
        rc = PushBigChunk( t, v );
    }
  }
  if ( typecode )
    *typecode = t;
  if ( value )
    *value = v;
  return rc;
}